

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

void png_build_16bit_table
               (png_structrp png_ptr,png_uint_16pp *ptable,uint shift,png_fixed_point gamma_val)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  png_uint_16pp pppVar4;
  png_uint_16 *ppVar5;
  byte bVar6;
  uint uVar7;
  uint j_1;
  long lVar8;
  ulong uVar9;
  double dVar10;
  
  cVar1 = (char)shift;
  bVar6 = 8 - cVar1;
  uVar3 = (ulong)(uint)(1 << (bVar6 & 0x1f));
  uVar7 = ~(-1 << (0x10U - cVar1 & 0x1f));
  pppVar4 = (png_uint_16pp)png_calloc(png_ptr,uVar3 * 8);
  *ptable = pppVar4;
  uVar9 = 0;
  do {
    ppVar5 = (png_uint_16 *)png_malloc(png_ptr,0x200);
    pppVar4[uVar9] = ppVar5;
    if (gamma_val - 95000U < 0x2711) {
      lVar8 = 0;
      do {
        uVar2 = ((int)lVar8 << (bVar6 & 0x1f)) + (int)uVar9;
        if (shift != 0) {
          uVar2 = (uVar2 * 0xffff + (1 << (0xfU - cVar1 & 0x1f))) / uVar7;
        }
        ppVar5[lVar8] = (png_uint_16)uVar2;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x100);
    }
    else {
      lVar8 = 0;
      do {
        dVar10 = pow((double)(uint)(((int)lVar8 << (bVar6 & 0x1f)) + (int)uVar9) *
                     (1.0 / (double)(int)uVar7),(double)gamma_val * 1e-05);
        dVar10 = floor(dVar10 * 65535.0 + 0.5);
        ppVar5[lVar8] = (png_uint_16)(int)dVar10;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x100);
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != uVar3);
  return;
}

Assistant:

static void
png_build_16bit_table(png_structrp png_ptr, png_uint_16pp *ptable,
    unsigned int shift, png_fixed_point gamma_val)
{
   /* Various values derived from 'shift': */
   unsigned int num = 1U << (8U - shift);
#ifdef PNG_FLOATING_ARITHMETIC_SUPPORTED
   /* CSE the division and work round wacky GCC warnings (see the comments
    * in png_gamma_8bit_correct for where these come from.)
    */
   double fmax = 1.0 / (((png_int_32)1 << (16U - shift)) - 1);
#endif
   unsigned int max = (1U << (16U - shift)) - 1U;
   unsigned int max_by_2 = 1U << (15U - shift);
   unsigned int i;

   png_uint_16pp table = *ptable =
       (png_uint_16pp)png_calloc(png_ptr, num * (sizeof (png_uint_16p)));

   for (i = 0; i < num; i++)
   {
      png_uint_16p sub_table = table[i] =
          (png_uint_16p)png_malloc(png_ptr, 256 * (sizeof (png_uint_16)));

      /* The 'threshold' test is repeated here because it can arise for one of
       * the 16-bit tables even if the others don't hit it.
       */
      if (png_gamma_significant(gamma_val) != 0)
      {
         /* The old code would overflow at the end and this would cause the
          * 'pow' function to return a result >1, resulting in an
          * arithmetic error.  This code follows the spec exactly; ig is
          * the recovered input sample, it always has 8-16 bits.
          *
          * We want input * 65535/max, rounded, the arithmetic fits in 32
          * bits (unsigned) so long as max <= 32767.
          */
         unsigned int j;
         for (j = 0; j < 256; j++)
         {
            png_uint_32 ig = (j << (8-shift)) + i;
#           ifdef PNG_FLOATING_ARITHMETIC_SUPPORTED
               /* Inline the 'max' scaling operation: */
               /* See png_gamma_8bit_correct for why the cast to (int) is
                * required here.
                */
               double d = floor(65535.*pow(ig*fmax, gamma_val*.00001)+.5);
               sub_table[j] = (png_uint_16)d;
#           else
               if (shift != 0)
                  ig = (ig * 65535U + max_by_2)/max;

               sub_table[j] = png_gamma_16bit_correct(ig, gamma_val);
#           endif
         }
      }
      else
      {
         /* We must still build a table, but do it the fast way. */
         unsigned int j;

         for (j = 0; j < 256; j++)
         {
            png_uint_32 ig = (j << (8-shift)) + i;

            if (shift != 0)
               ig = (ig * 65535U + max_by_2)/max;

            sub_table[j] = (png_uint_16)ig;
         }
      }
   }
}